

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O1

Rect * __thiscall
RTree<int,_double,_2,_double,_8,_4>::NodeCover
          (Rect *__return_storage_ptr__,RTree<int,_double,_2,_double,_8,_4> *this,Node *a_node)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  Rect *a_rectB;
  Rect local_50;
  
  if (a_node != (Node *)0x0) {
    dVar1 = a_node->m_branch[0].m_rect.m_min[0];
    dVar2 = a_node->m_branch[0].m_rect.m_min[1];
    dVar3 = a_node->m_branch[0].m_rect.m_max[1];
    __return_storage_ptr__->m_max[0] = a_node->m_branch[0].m_rect.m_max[0];
    __return_storage_ptr__->m_max[1] = dVar3;
    __return_storage_ptr__->m_min[0] = dVar1;
    __return_storage_ptr__->m_min[1] = dVar2;
    if (1 < a_node->m_count) {
      a_rectB = &a_node->m_branch[1].m_rect;
      lVar4 = 1;
      do {
        CombineRect(&local_50,this,__return_storage_ptr__,a_rectB);
        __return_storage_ptr__->m_max[0] = local_50.m_max[0];
        __return_storage_ptr__->m_max[1] = local_50.m_max[1];
        __return_storage_ptr__->m_min[0] = local_50.m_min[0];
        __return_storage_ptr__->m_min[1] = local_50.m_min[1];
        lVar4 = lVar4 + 1;
        a_rectB = (Rect *)a_rectB[1].m_max;
      } while (lVar4 < a_node->m_count);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("a_node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                ,0x412,
                "typename RTree<DATATYPE, ELEMTYPE, NUMDIMS, ELEMTYPEREAL, TMAXNODES, TMINNODES>::Rect RTree<int, double, 2>::NodeCover(Node *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
               );
}

Assistant:

RTREE_TEMPLATE
typename RTREE_QUAL::Rect RTREE_QUAL::NodeCover(Node* a_node)
{
  ASSERT(a_node);
  
  Rect rect = a_node->m_branch[0].m_rect;
  for(int index = 1; index < a_node->m_count; ++index)
  {
     rect = CombineRect(&rect, &(a_node->m_branch[index].m_rect));
  }
  
  return rect;
}